

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O3

void __thiscall
helics::Input::Input
          (Input *this,InterfaceVisibility locality,ValueFederate *valueFed,string_view key,
          string_view defaultType,string_view units)

{
  Core **ppCVar1;
  string *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DataType DVar8;
  DataType DVar9;
  int32_t iVar10;
  undefined4 uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 uVar16;
  MultiInputHandlingMethod MVar17;
  Input *pIVar18;
  anon_class_8_1_8991fb9c_conflict local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  ValueFederate *local_48;
  size_t local_40;
  char *local_38;
  
  local_38 = key._M_str;
  local_40 = key._M_len;
  ppCVar1 = &(this->super_Interface).mCore;
  (this->super_Interface).mCore = (Core *)0x0;
  (this->super_Interface).handle.hid = -1700000000;
  this_00 = &(this->super_Interface).mName;
  local_50 = &(this->super_Interface).mName.field_2;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)local_50;
  (this->super_Interface).mName._M_string_length = 0;
  (this->super_Interface).mName.field_2._M_local_buf[0] = '\0';
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Input_005462b8;
  this->fed = (ValueFederate *)0x0;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->targetType = HELICS_UNKNOWN;
  this->injectionType = HELICS_UNKNOWN;
  this->inputVectorOp = NO_OP;
  this->prevInputCount = 0;
  this->customTypeHash = 0;
  this->changeDetectionEnabled = false;
  this->hasUpdate = false;
  this->disableAssign = false;
  this->useThreshold = false;
  this->multiUnits = false;
  *(undefined8 *)
   &(this->lastValue).
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    .
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = 0xca1b5e7e08ca3a8f;
  *(__index_type *)
   ((long)&(this->lastValue).
           super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           .
           super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
   + 0x28) = '\0';
  local_58 = &(this->givenTarget).field_2;
  (this->sourceTypes).
  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sourceTypes).
  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceTypes).
  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->givenTarget)._M_dataplus._M_p = (pointer)local_58;
  (this->givenTarget)._M_string_length = 0;
  (this->givenTarget).field_2._M_local_buf[0] = '\0';
  this->delta = -1.0;
  this->threshold = 0.0;
  *(undefined8 *)
   &(this->value_callback).
    super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
    .
    super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 0x10) = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 0x11) = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 0x19) = 0;
  local_60.this =
       (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)&this->lastValue;
  local_48 = valueFed;
  if (locality == GLOBAL) {
    pIVar18 = helics::ValueFederate::registerGlobalInput(valueFed,key,defaultType,units);
    (this->super_Interface).handle.hid = (pIVar18->super_Interface).handle.hid;
    *ppCVar1 = (pIVar18->super_Interface).mCore;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this_00,&(pIVar18->super_Interface).mName);
    this->customTypeHash = pIVar18->customTypeHash;
    uVar2 = *(undefined4 *)&pIVar18->fed;
    uVar3 = *(undefined4 *)((long)&pIVar18->fed + 4);
    iVar4 = pIVar18->referenceIndex;
    uVar5 = *(undefined4 *)&pIVar18->field_0x44;
    uVar6 = *(undefined4 *)&pIVar18->dataReference;
    uVar7 = *(undefined4 *)((long)&pIVar18->dataReference + 4);
    DVar8 = pIVar18->targetType;
    DVar9 = pIVar18->injectionType;
    bVar12 = pIVar18->hasUpdate;
    bVar13 = pIVar18->disableAssign;
    bVar14 = pIVar18->useThreshold;
    bVar15 = pIVar18->multiUnits;
    uVar16 = pIVar18->field_0x5d;
    MVar17 = pIVar18->inputVectorOp;
    iVar10 = pIVar18->prevInputCount;
    uVar11 = *(undefined4 *)&pIVar18->field_0x64;
    this->changeDetectionEnabled = pIVar18->changeDetectionEnabled;
    this->hasUpdate = bVar12;
    this->disableAssign = bVar13;
    this->useThreshold = bVar14;
    this->multiUnits = bVar15;
    this->field_0x5d = uVar16;
    this->inputVectorOp = MVar17;
    this->prevInputCount = iVar10;
    *(undefined4 *)&this->field_0x64 = uVar11;
    *(undefined4 *)&this->dataReference = uVar6;
    *(undefined4 *)((long)&this->dataReference + 4) = uVar7;
    this->targetType = DVar8;
    this->injectionType = DVar9;
    *(undefined4 *)&this->fed = uVar2;
    *(undefined4 *)((long)&this->fed + 4) = uVar3;
    this->referenceIndex = iVar4;
    *(undefined4 *)&this->field_0x44 = uVar5;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
      ::_S_vtable._M_arr
      [(long)(char)*(__index_type *)
                    ((long)&(pIVar18->lastValue).
                            super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                            .
                            super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                    + 0x28) + 1]._M_data)(&local_60,&pIVar18->lastValue);
    (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pIVar18->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->outputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pIVar18->outputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pIVar18->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pIVar18->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
    ::operator=(&this->sourceTypes,&pIVar18->sourceTypes);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->givenTarget,&pIVar18->givenTarget);
    uVar2 = *(undefined4 *)((long)&pIVar18->delta + 4);
    uVar3 = *(undefined4 *)&pIVar18->threshold;
    uVar5 = *(undefined4 *)((long)&pIVar18->threshold + 4);
    *(undefined4 *)&this->delta = *(undefined4 *)&pIVar18->delta;
    *(undefined4 *)((long)&this->delta + 4) = uVar2;
    *(undefined4 *)&this->threshold = uVar3;
    *(undefined4 *)((long)&this->threshold + 4) = uVar5;
    local_60.this =
         (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
          *)&this->value_callback;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(pIVar18->value_callback).
                super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                .
                super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
        + 0x20)]._M_data)((anon_class_8_1_8991fb9c_conflict1 *)&local_60,&pIVar18->value_callback);
  }
  else {
    pIVar18 = helics::ValueFederate::registerInput(valueFed,key,defaultType,units);
    (this->super_Interface).handle.hid = (pIVar18->super_Interface).handle.hid;
    *ppCVar1 = (pIVar18->super_Interface).mCore;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this_00,&(pIVar18->super_Interface).mName);
    this->customTypeHash = pIVar18->customTypeHash;
    uVar2 = *(undefined4 *)&pIVar18->fed;
    uVar3 = *(undefined4 *)((long)&pIVar18->fed + 4);
    iVar4 = pIVar18->referenceIndex;
    uVar5 = *(undefined4 *)&pIVar18->field_0x44;
    uVar6 = *(undefined4 *)&pIVar18->dataReference;
    uVar7 = *(undefined4 *)((long)&pIVar18->dataReference + 4);
    DVar8 = pIVar18->targetType;
    DVar9 = pIVar18->injectionType;
    bVar12 = pIVar18->hasUpdate;
    bVar13 = pIVar18->disableAssign;
    bVar14 = pIVar18->useThreshold;
    bVar15 = pIVar18->multiUnits;
    uVar16 = pIVar18->field_0x5d;
    MVar17 = pIVar18->inputVectorOp;
    iVar10 = pIVar18->prevInputCount;
    uVar11 = *(undefined4 *)&pIVar18->field_0x64;
    this->changeDetectionEnabled = pIVar18->changeDetectionEnabled;
    this->hasUpdate = bVar12;
    this->disableAssign = bVar13;
    this->useThreshold = bVar14;
    this->multiUnits = bVar15;
    this->field_0x5d = uVar16;
    this->inputVectorOp = MVar17;
    this->prevInputCount = iVar10;
    *(undefined4 *)&this->field_0x64 = uVar11;
    *(undefined4 *)&this->dataReference = uVar6;
    *(undefined4 *)((long)&this->dataReference + 4) = uVar7;
    this->targetType = DVar8;
    this->injectionType = DVar9;
    *(undefined4 *)&this->fed = uVar2;
    *(undefined4 *)((long)&this->fed + 4) = uVar3;
    this->referenceIndex = iVar4;
    *(undefined4 *)&this->field_0x44 = uVar5;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
      ::_S_vtable._M_arr
      [(long)(char)*(__index_type *)
                    ((long)&(pIVar18->lastValue).
                            super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                            .
                            super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                    + 0x28) + 1]._M_data)(&local_60,&pIVar18->lastValue);
    (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pIVar18->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->outputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pIVar18->outputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pIVar18->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pIVar18->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
    ::operator=(&this->sourceTypes,&pIVar18->sourceTypes);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->givenTarget,&pIVar18->givenTarget);
    uVar2 = *(undefined4 *)((long)&pIVar18->delta + 4);
    uVar3 = *(undefined4 *)&pIVar18->threshold;
    uVar5 = *(undefined4 *)((long)&pIVar18->threshold + 4);
    *(undefined4 *)&this->delta = *(undefined4 *)&pIVar18->delta;
    *(undefined4 *)((long)&this->delta + 4) = uVar2;
    *(undefined4 *)&this->threshold = uVar3;
    *(undefined4 *)((long)&this->threshold + 4) = uVar5;
    local_60.this =
         (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
          *)&this->value_callback;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(pIVar18->value_callback).
                super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                .
                super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                .
                super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
        + 0x20)]._M_data)((anon_class_8_1_8991fb9c_conflict1 *)&local_60,&pIVar18->value_callback);
  }
  return;
}

Assistant:

Input::Input(InterfaceVisibility locality,
             ValueFederate* valueFed,
             std::string_view key,
             std::string_view defaultType,
             std::string_view units)
{
    try {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(valueFed->registerGlobalInput(key, defaultType, units));
        } else {
            operator=(valueFed->registerInput(key, defaultType, units));
        }
    }
    catch (const RegistrationFailure&) {
        operator=(valueFed->getInput(key));
        if (!isValid()) {
            throw;
        }
    }
}